

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vec4 *pVVar2;
  Vec4 *pVVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  int col;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  float fVar11;
  float afStack_50 [2];
  undefined8 local_48;
  float local_40;
  Type in0;
  int aiStack_18 [6];
  long lVar9;
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar10 = true;
    do {
      bVar4 = bVar10;
      lVar7 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar10) {
          fVar11 = 1.0;
          if (lVar5 != lVar7) {
            fVar11 = 0.0;
          }
          pfVar6[lVar7 * 2] = fVar11;
        }
        if (bVar10) {
          fVar11 = 1.0;
          if (lVar5 + -1 != lVar7) {
            fVar11 = 0.0;
          }
          pfVar6[lVar7 * 2 + 2] = fVar11;
        }
        lVar7 = lVar7 + 2;
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
      } while (lVar7 != 4);
      lVar5 = 1;
      pfVar6 = pfVar1;
      bVar10 = false;
    } while (bVar4);
    pVVar3 = evalCtx->in;
    in0.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    in0.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    in0.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[0];
    pVVar2 = evalCtx->in + 2;
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar10 = true;
    do {
      bVar4 = bVar10;
      lVar7 = 0;
      do {
        pfVar6[lVar7 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar5 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar5 = 0xc;
      pfVar6 = pfVar1;
      bVar10 = false;
    } while (bVar4);
    pVVar3 = (Vec4 *)&in0;
    pVVar2 = (Vec4 *)(in0.m_data.m_data + 2);
  }
  local_48 = CONCAT44(in0.m_data.m_data[1].m_data[1] + in0.m_data.m_data[1].m_data[0],
                      ((Vector<tcu::Vector<float,_2>,_3> *)pVVar3->m_data)->m_data[0].m_data[0] +
                      in0.m_data.m_data[0].m_data[1]);
  local_40 = in0.m_data.m_data[2].m_data[0] + *(float *)((long)pVVar2->m_data + 4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = afStack_50[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}